

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O3

void lowmc_compute_aux(lowmc_parameters_t *lowmc,lowmc_key_t *key,randomTape_t *tapes)

{
  sbyte sVar1;
  word256 v;
  word256 v_00;
  word256 v_01;
  word256 v_02;
  word256 v_03;
  word256 v_04;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  anon_union_8_2_94730226_for_buffer size;
  byte *pbVar6;
  uint8_t *puVar7;
  ulong *puVar8;
  uint uVar9;
  long lVar10;
  word *pwVar11;
  byte bVar12;
  uint uVar13;
  word *pwVar14;
  mzd_local_t *pmVar15;
  int iVar16;
  size_t bits;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  lowmc_round_t *plVar27;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  mzd_local_t y [1];
  undefined1 in_stack_fffffffffffffe40 [24];
  randomTape_t *prVar63;
  anon_union_8_2_94730226_for_buffer local_1a0;
  ulong uStack_198;
  ulong auStack_190 [4];
  ulong local_170;
  undefined1 uStack_169;
  undefined1 local_168 [8];
  mzd_local_t local_160;
  anon_union_8_2_94730226_for_buffer local_130;
  ulong local_128;
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  uint local_e4;
  undefined1 local_e0 [32];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  mzd_local_t local_80 [2];
  
  uVar3 = (uint)lowmc->n << 0x10 | (uint)lowmc->m;
  local_168 = (undefined1  [8])key;
  if ((~DAT_001c939c & 0x20400) == 0) {
    if (uVar3 == 0xff0055) {
      local_160.w64[0] = 0;
      local_160.w64[1] = 0;
      local_160.w64[2] = 0;
      local_160.w64[3] = 0;
      mzd_copy_s256_256(local_80,key);
      mzd_mul_v_s256_256(key,local_80,Ki_0);
      plVar27 = rounds + 3;
      local_170 = 0;
      local_b0._0_4_ = 0x5fa;
      do {
        mzd_addmul_v_s256_256(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
        local_100._0_8_ = plVar27;
        mzd_mul_v_s256_256((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
        if (local_170 == 3) {
          mzd_copy_s256_256(&local_160,local_80);
          local_e0._0_8_ = 0;
          iVar20 = 0;
          puVar7 = tapes->parity_tapes;
          prVar63 = tapes;
        }
        else {
          uVar19 = 0xff;
          lVar26 = 3 - local_170;
          local_120._0_8_ = lVar26;
          puVar7 = tapes->parity_tapes;
          uVar9 = local_b0._0_4_ & 6;
          uVar3 = -uVar9 - 0x2f;
          uVar23 = (ulong)uVar9 + 0x37;
          uVar17 = (ulong)(uint)((int)lVar26 << 9) + lVar26 * -2;
          pwVar11 = local_160.w64 + 3;
          uVar4 = uVar17;
          do {
            pwVar14 = pwVar11;
            pbVar6 = puVar7 + (uVar4 >> 3) + 1;
            bVar12 = 8 - ((byte)uVar4 & 6);
            sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
            uVar24 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
            uVar22 = (ulong)uVar9 + 0x38;
            uVar25 = -uVar9 - 0x30;
            do {
              bVar18 = *pbVar6;
              pbVar6 = pbVar6 + 1;
              uVar25 = uVar25 + 8;
              uVar22 = uVar22 - 8;
              uVar24 = (ulong)bVar18 | uVar24 << 8;
            } while (7 < (uint)uVar22);
            if ((uint)uVar22 != 0) {
              sVar1 = ((byte)uVar22 < 0x21) * (' ' - (byte)uVar22);
              uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                       uVar24 << (uVar22 & 0x3f);
            }
            uVar4 = uVar4 + 0x40;
            uVar19 = uVar19 - 0x40;
            *pwVar14 = uVar24;
            pwVar11 = pwVar14 + -1;
          } while (0x3f < uVar19);
          pbVar6 = puVar7 + (uVar4 >> 3) + 1;
          uVar4 = (ulong)((uint)pbVar6[-1] & ~(-1 << (bVar12 & 0x1f)));
          do {
            bVar12 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar3 = uVar3 + 8;
            uVar23 = uVar23 - 8;
            uVar4 = (ulong)bVar12 | uVar4 << 8;
          } while (7 < (uint)uVar23);
          if ((uint)uVar23 != 0) {
            sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
            uVar4 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                    uVar4 << (uVar23 & 0x3f);
          }
          local_160.w64[0] = uVar4 * 2;
          pwVar14 = pwVar14 + -2;
          lVar26 = (long)pwVar14 - (long)&local_160;
          local_e0._0_8_ = uVar17;
          if (&local_160 <= pwVar14) {
            memset((void *)((long)pwVar14 - lVar26),0,lVar26 + 8);
          }
          iVar20 = local_120._0_4_;
          prVar63 = tapes;
        }
        local_128 = local_e0._0_8_ + 0xff;
        bVar12 = (char)local_e0._0_8_ + 6;
        uVar19 = 0xff;
        puVar8 = auStack_190 + 1;
        prVar63->pos = (uint32_t)local_128;
        local_e0._0_8_ = local_128;
        prVar63->aux_pos = iVar20 * 0xff;
        auVar39._8_8_ = local_160.w64[1];
        auVar39._0_8_ = local_160.w64[0];
        auVar39._16_8_ = local_160.w64[2];
        auVar39._24_8_ = local_160.w64[3];
        auVar56._16_16_ = auStack_90;
        auVar56._0_16_ = local_a0;
        local_130 = (anon_union_8_2_94730226_for_buffer)
                    ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
        auStack_190[1] = 0;
        uVar3 = bVar12 & 7;
        uVar17 = (ulong)(bVar12 & 7);
        uVar25 = ~(-1 << ((byte)(8 - ((byte)local_128 & 7)) & 0x1f));
        uVar9 = uVar3 ^ 0xffffffcf;
        uVar23 = uVar17 + 0x39;
        uVar4 = local_128;
        do {
          uVar22 = uVar4;
          pbVar6 = puVar7 + (uVar22 >> 3) + 1;
          uVar24 = (ulong)(pbVar6[-1] & uVar25);
          uVar4 = uVar23;
          uVar13 = uVar9;
          do {
            bVar12 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar13 = uVar13 + 8;
            uVar4 = uVar4 - 8;
            uVar24 = (ulong)bVar12 | uVar24 << 8;
          } while (7 < (uint)uVar4);
          if ((uint)uVar4 != 0) {
            sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
            uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar13 & 0x1f)) << sVar1) >> sVar1) |
                     uVar24 << (uVar4 & 0x3f);
          }
          *puVar8 = uVar24;
          uVar19 = uVar19 - 0x40;
          puVar8 = puVar8 + -1;
          uVar4 = uVar22 + 0x40;
        } while (0x3f < uVar19);
        uVar17 = uVar17 | 0x38;
        pbVar6 = puVar7 + (uVar22 + 0x40 >> 3) + 1;
        bVar12 = 8 - ((byte)uVar22 & 7);
        uVar13 = -uVar3 - 0x30;
        sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
        uVar19 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
        uVar4 = uVar17;
        uVar3 = uVar13;
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar3 = uVar3 + 8;
          uVar4 = uVar4 - 8;
          uVar19 = (ulong)bVar12 | uVar19 << 8;
        } while (7 < (uint)uVar4);
        if ((uint)uVar4 != 0) {
          sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
          uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                   uVar19 << (uVar4 & 0x3f);
        }
        puVar8 = auStack_190 + 1;
        uVar22 = 0xff;
        auVar43._24_8_ = auStack_190[1];
        auVar43._0_24_ = ZEXT824(uVar19 * 2);
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        uVar4 = local_128;
        do {
          uVar19 = uVar4;
          pbVar6 = local_130.w + (uVar19 >> 3) + 1;
          uVar24 = (ulong)(pbVar6[-1] & uVar25);
          uVar4 = uVar23;
          uVar3 = uVar9;
          do {
            bVar12 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar3 = uVar3 + 8;
            uVar4 = uVar4 - 8;
            uVar24 = (ulong)bVar12 | uVar24 << 8;
          } while (7 < (uint)uVar4);
          if ((uint)uVar4 != 0) {
            sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
            uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                     uVar24 << (uVar4 & 0x3f);
          }
          *puVar8 = uVar24;
          uVar22 = uVar22 - 0x40;
          puVar8 = puVar8 + -1;
          uVar4 = uVar19 + 0x40;
        } while (0x3f < uVar22);
        pbVar6 = local_130.w + (uVar19 + 0x40 >> 3) + 1;
        bVar12 = 8 - ((byte)uVar19 & 7);
        sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
        uVar23 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar13 = uVar13 + 8;
          uVar17 = uVar17 - 8;
          uVar23 = (ulong)bVar12 | uVar23 << 8;
        } while (7 < (uint)uVar17);
        if ((uint)uVar17 != 0) {
          sVar1 = ((byte)uVar17 < 0x21) * (' ' - (byte)uVar17);
          uVar23 = (ulong)(((uint)(*pbVar6 >> (uVar13 & 0x1f)) << sVar1) >> sVar1) |
                   uVar23 << (uVar17 & 0x3f);
        }
        local_1a0.w = (uint8_t *)(uVar23 * 2);
        auVar40 = vpand_avx2(auVar39,_DAT_0013a6c0);
        auVar45 = vpand_avx2(auVar56,_DAT_0013a6e0);
        auVar46 = vpand_avx2(auVar39,_DAT_0013a700);
        auVar48 = vpsllq_avx2(auVar40,2);
        auVar52 = vpsrlq_avx2(auVar40,0x3e);
        auVar40 = vpaddq_avx2(auVar45,auVar45);
        auVar51 = vpsrlq_avx2(auVar45,0x3f);
        auVar45 = vpermq_avx2(auVar52,0x93);
        auVar47 = vpermq_avx2(auVar51,0x93);
        auVar52 = vpor_avx2(auVar45,auVar48);
        auVar51 = vpand_avx2(auVar39,_DAT_0013a6e0);
        auVar45 = vpaddq_avx2(auVar51,auVar51);
        auVar48 = vpsrlq_avx2(auVar51,0x3f);
        auVar51 = vpand_avx2(auVar46,auVar52);
        auVar48 = vpermq_avx2(auVar48,0x93);
        auVar48 = vpor_avx2(auVar48,auVar45);
        auVar45 = vpand_avx2(auVar46,auVar48);
        auVar40 = vpternlogq_avx512vl(auVar47,auVar52 ^ auVar48,auVar40,0x36);
        auVar46 = vpsrlq_avx2(auVar40,2);
        auVar40 = vpsllq_avx2(auVar40,0x3e);
        auVar40 = vpermq_avx2(auVar40,0x39);
        auVar46 = vpor_avx2(auVar40,auVar46);
        auVar40 = vpand_avx2(auVar56,_DAT_0013a6c0);
        auVar55 = vpsrlq_avx2(auVar51,2);
        auVar51 = vpsllq_avx2(auVar51,0x3e);
        auVar47 = vpsllq_avx2(auVar40,2);
        auVar40 = vpsrlq_avx2(auVar40,0x3e);
        auVar51 = vpermq_avx2(auVar51,0x39);
        auVar40 = vpermq_avx2(auVar40,0x93);
        auVar47 = vpternlogq_avx512vl(auVar40,auVar52,auVar47,0x36);
        auVar40 = vpand_avx2(auVar52,auVar48);
        auVar49 = vpsrlq_avx2(auVar45,1);
        auVar45 = vpsllq_avx2(auVar45,0x3f);
        auVar45 = vpermq_avx2(auVar45,0x39);
        auVar39 = vpternlogq_avx512vl(auVar40,auVar39 ^ auVar56,_DAT_0013a700,0x78);
        auVar54 = vpsrlq_avx2(auVar47,1);
        auVar40 = vpsllq_avx2(auVar47,0x3f);
        auVar56 = vpternlogq_avx512vl(auVar39,auVar45,auVar49,0x1e);
        auVar39 = vpermq_avx2(auVar40,0x39);
        auVar56 = vpternlogq_avx512vl(auVar56,auVar51,auVar55,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar56,auVar39,auVar54,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar43,auVar39,auVar46,0x96);
        auVar40._24_8_ = auStack_190[1];
        auVar40._0_24_ = ZEXT824((ulong)local_1a0);
        local_120 = vpternlogq_avx512vl(auVar39,auVar52 ^ auVar48,auVar40,0x96);
        v_01[3] = (longlong)prVar63;
        v_01[0] = in_stack_fffffffffffffe40._0_8_;
        v_01[1] = in_stack_fffffffffffffe40._8_8_;
        v_01[2] = in_stack_fffffffffffffe40._16_8_;
        w256_to_bitstream((bitstream_t *)&local_130,v_01,4,0xff);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
        uStack_198 = (ulong)prVar63->aux_pos;
        v_02[3] = (longlong)prVar63;
        v_02[0] = in_stack_fffffffffffffe40._0_8_;
        v_02[1] = in_stack_fffffffffffffe40._8_8_;
        v_02[2] = in_stack_fffffffffffffe40._16_8_;
        tapes = prVar63;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_02,4,0xff);
        prVar63->aux_pos = prVar63->aux_pos + 0xff;
        local_b0._0_4_ = local_b0._0_4_ + -0x1fe;
        local_170 = local_170 + 1;
        plVar27 = (lowmc_round_t *)(local_100._0_8_ + -0x20);
      } while (local_170 != 4);
    }
    else if (uVar3 == 0xc00040) {
      local_160.w64[0] = 0;
      local_160.w64[1] = 0;
      local_160.w64[2] = 0;
      local_160.w64[3] = 0;
      mzd_copy_s256_256(local_80,key);
      mzd_mul_v_s256_192(key,local_80,Ki_0);
      plVar27 = rounds + 3;
      uVar23 = 0x480;
      puVar5 = &stack0xfffffffffffffe90;
      if ((undefined8 *)((long)local_168 + 7) < &stack0xfffffffffffffe90) {
        puVar5 = (undefined8 *)((long)local_168 + 7);
      }
      lVar26 = 0;
      uVar4 = (long)local_168 + (0xffffffffffffffffU - (long)puVar5) & 0xfffffffffffffff8;
      local_100._0_8_ = uVar4 + 8;
      local_120._0_8_ = (long)local_168 - uVar4;
      do {
        mzd_addmul_v_s256_192(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
        mzd_mul_v_s256_192((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
        local_170 = uVar23;
        if (lVar26 == 3) {
          mzd_copy_s256_256(&local_160,local_80);
          uVar4 = 0;
          iVar20 = 0;
          puVar7 = tapes->parity_tapes;
          prVar63 = tapes;
        }
        else {
          pwVar11 = local_160.w64 + 2;
          iVar20 = 3 - (int)lVar26;
          uVar4 = (ulong)(uint)(iVar20 * 0x80) * 3;
          lVar10 = 0xc0;
          puVar7 = tapes->parity_tapes;
          pbVar6 = puVar7 + (uVar23 >> 3) + 1;
          uVar23 = uVar4;
          do {
            iVar16 = -0x38;
            uVar17 = (ulong)puVar7[uVar23 >> 3];
            pbVar21 = pbVar6;
            do {
              bVar12 = *pbVar21;
              pbVar21 = pbVar21 + 1;
              uVar17 = (ulong)bVar12 | uVar17 << 8;
              iVar16 = iVar16 + 8;
            } while (iVar16 != 0);
            *pwVar11 = uVar17;
            uVar23 = uVar23 + 0x40;
            pwVar11 = pwVar11 + -1;
            pbVar6 = pbVar6 + 8;
            lVar10 = lVar10 + -0x40;
          } while (lVar10 != 0);
          prVar63 = tapes;
          if (&local_160 <= pwVar11) {
            memset((void *)local_120._0_8_,0,local_100._0_8_);
            prVar63 = tapes;
          }
        }
        uVar23 = local_170;
        local_128 = uVar4 + 0xc0;
        lVar10 = 0xc0;
        puVar8 = auStack_190;
        prVar63->pos = (uint32_t)local_128;
        prVar63->aux_pos = iVar20 * 0xc0;
        auVar52._8_8_ = local_160.w64[1];
        auVar52._0_8_ = local_160.w64[0];
        auVar52._16_8_ = local_160.w64[2];
        auVar52._24_8_ = local_160.w64[3];
        auVar48._16_16_ = auStack_90;
        auVar48._0_16_ = local_a0;
        local_130 = (anon_union_8_2_94730226_for_buffer)
                    ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
        uVar17 = local_128 >> 3 & 0x1fffffff;
        auStack_190[0] = 0;
        pbVar6 = puVar7 + uVar17 + 1;
        uVar4 = local_128;
        do {
          iVar20 = -0x38;
          uVar19 = (ulong)puVar7[uVar4 >> 3];
          pbVar21 = pbVar6;
          do {
            bVar12 = *pbVar21;
            pbVar21 = pbVar21 + 1;
            uVar19 = (ulong)bVar12 | uVar19 << 8;
            iVar20 = iVar20 + 8;
          } while (iVar20 != 0);
          *puVar8 = uVar19;
          uVar4 = uVar4 + 0x40;
          puVar8 = puVar8 + -1;
          pbVar6 = pbVar6 + 8;
          lVar10 = lVar10 + -0x40;
        } while (lVar10 != 0);
        auVar49._16_8_ = auStack_190[0];
        auVar49._0_16_ = ZEXT816(0);
        auVar49._24_8_ = 0;
        pbVar6 = local_130.w + uVar17 + 1;
        lVar10 = 0xc0;
        puVar8 = auStack_190;
        local_1a0.w = (uint8_t *)0x0;
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        uVar4 = local_128;
        do {
          iVar20 = -0x38;
          uVar17 = (ulong)local_130.w[uVar4 >> 3];
          pbVar21 = pbVar6;
          do {
            bVar12 = *pbVar21;
            pbVar21 = pbVar21 + 1;
            uVar17 = (ulong)bVar12 | uVar17 << 8;
            iVar20 = iVar20 + 8;
          } while (iVar20 != 0);
          *puVar8 = uVar17;
          uVar4 = uVar4 + 0x40;
          puVar8 = puVar8 + -1;
          pbVar6 = pbVar6 + 8;
          lVar10 = lVar10 + -0x40;
        } while (lVar10 != 0);
        auVar39 = vpand_avx2(auVar52,_DAT_0013a660);
        auVar56 = vpand_avx2(auVar48,_DAT_0013a680);
        auVar43 = vpand_avx2(auVar52,_DAT_0013a6a0);
        auVar46 = vpsllq_avx2(auVar39,2);
        auVar45 = vpsrlq_avx2(auVar39,0x3e);
        auVar39 = vpaddq_avx2(auVar56,auVar56);
        auVar40 = vpsrlq_avx2(auVar56,0x3f);
        auVar56 = vpermq_avx2(auVar45,0x93);
        auVar51 = vpermq_avx2(auVar40,0x93);
        auVar45 = vpor_avx2(auVar56,auVar46);
        auVar40 = vpand_avx2(auVar52,_DAT_0013a680);
        auVar56 = vpaddq_avx2(auVar40,auVar40);
        auVar46 = vpsrlq_avx2(auVar40,0x3f);
        auVar40 = vpand_avx2(auVar43,auVar45);
        auVar46 = vpermq_avx2(auVar46,0x93);
        auVar46 = vpor_avx2(auVar46,auVar56);
        auVar56 = vpand_avx2(auVar43,auVar46);
        auVar39 = vpternlogq_avx512vl(auVar51,auVar45 ^ auVar46,auVar39,0x36);
        auVar43 = vpsrlq_avx2(auVar39,2);
        auVar39 = vpsllq_avx2(auVar39,0x3e);
        auVar39 = vpermq_avx2(auVar39,0x39);
        auVar43 = vpor_avx2(auVar39,auVar43);
        auVar39 = vpand_avx2(auVar48,_DAT_0013a660);
        auVar54 = vpsrlq_avx2(auVar40,2);
        auVar40 = vpsllq_avx2(auVar40,0x3e);
        auVar51 = vpsllq_avx2(auVar39,2);
        auVar39 = vpsrlq_avx2(auVar39,0x3e);
        auVar40 = vpermq_avx2(auVar40,0x39);
        auVar39 = vpermq_avx2(auVar39,0x93);
        auVar51 = vpternlogq_avx512vl(auVar39,auVar45,auVar51,0x36);
        auVar39 = vpand_avx2(auVar45,auVar46);
        auVar47 = vpsrlq_avx2(auVar56,1);
        auVar56 = vpsllq_avx2(auVar56,0x3f);
        auVar56 = vpermq_avx2(auVar56,0x39);
        auVar39 = vpternlogq_avx512vl(auVar39,auVar52 ^ auVar48,_DAT_0013a6a0,0x78);
        auVar52 = vpsrlq_avx2(auVar51,1);
        auVar51 = vpsllq_avx2(auVar51,0x3f);
        auVar56 = vpternlogq_avx512vl(auVar39,auVar56,auVar47,0x1e);
        auVar39 = vpermq_avx2(auVar51,0x39);
        auVar56 = vpternlogq_avx512vl(auVar56,auVar40,auVar54,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar56,auVar39,auVar52,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar49,auVar39,auVar43,0x96);
        auVar54._16_8_ = auStack_190[0];
        auVar54._0_16_ = ZEXT816(0);
        auVar54._24_8_ = 0;
        local_e0 = vpternlogq_avx512vl(auVar39,auVar45 ^ auVar46,auVar54,0x96);
        v[3] = (longlong)prVar63;
        v[0] = in_stack_fffffffffffffe40._0_8_;
        v[1] = in_stack_fffffffffffffe40._8_8_;
        v[2] = in_stack_fffffffffffffe40._16_8_;
        w256_to_bitstream((bitstream_t *)&local_130,v,3,0xc0);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
        uStack_198 = (ulong)prVar63->aux_pos;
        v_00[3] = (longlong)prVar63;
        v_00[0] = in_stack_fffffffffffffe40._0_8_;
        v_00[1] = in_stack_fffffffffffffe40._8_8_;
        v_00[2] = in_stack_fffffffffffffe40._16_8_;
        tapes = prVar63;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_00,3,0xc0);
        prVar63->aux_pos = prVar63->aux_pos + 0xc0;
        lVar26 = lVar26 + 1;
        plVar27 = plVar27 + -1;
        uVar23 = uVar23 - 0x180;
      } while (lVar26 != 4);
    }
    else {
      local_160.w64[0] = 0;
      local_160.w64[1] = 0;
      local_160.w64[2] = 0;
      local_160.w64[3] = 0;
      mzd_copy_s256_256(local_80,key);
      mzd_mul_v_s256_129(key,local_80,Ki_0);
      plVar27 = rounds + 3;
      uVar3 = 0x306;
      local_170 = 0;
      do {
        mzd_addmul_v_s256_129(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
        local_e0._0_8_ = plVar27;
        mzd_mul_v_s256_129((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
        local_100._0_4_ = uVar3;
        if (local_170 == 3) {
          mzd_copy_s256_256(&local_160,local_80);
          uVar17 = 0;
          uVar3 = 0;
          puVar7 = tapes->parity_tapes;
          prVar63 = tapes;
        }
        else {
          uVar4 = 0x81;
          lVar26 = 3 - local_170;
          local_120._0_8_ = lVar26;
          puVar7 = tapes->parity_tapes;
          uVar17 = (ulong)(uint)((int)lVar26 * 0x102);
          pwVar11 = local_160.w64 + 2;
          uVar23 = uVar17;
          do {
            pwVar14 = pwVar11;
            uVar25 = (uint)uVar23 & 6;
            pbVar6 = puVar7 + (uVar23 >> 3) + 1;
            bVar12 = 8 - (char)uVar25;
            sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
            uVar22 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
            uVar19 = (ulong)(uVar3 & 6) | 0x38;
            uVar9 = -(uVar3 & 6) - 0x30;
            do {
              bVar18 = *pbVar6;
              pbVar6 = pbVar6 + 1;
              uVar9 = uVar9 + 8;
              uVar19 = uVar19 - 8;
              uVar22 = (ulong)bVar18 | uVar22 << 8;
            } while (7 < (uint)uVar19);
            if ((uint)uVar19 != 0) {
              sVar1 = ((byte)uVar19 < 0x21) * (' ' - (byte)uVar19);
              uVar22 = (ulong)(((uint)(*pbVar6 >> (uVar9 & 0x1f)) << sVar1) >> sVar1) |
                       uVar22 << (uVar19 & 0x3f);
            }
            uVar23 = uVar23 + 0x40;
            uVar4 = uVar4 - 0x40;
            *pwVar14 = uVar22;
            pwVar11 = pwVar14 + -1;
          } while (0x3f < uVar4);
          pmVar15 = (mzd_local_t *)(pwVar14 + -2);
          local_160.w64[0] =
               (ulong)(((uint)puVar7[uVar23 >> 3] & ~(-1 << (bVar12 & 0x1f))) >> ((ulong)uVar25 ^ 7)
                      ) << 0x3f;
          lVar10 = (long)pmVar15 - (long)&local_160;
          if (&local_160 <= pmVar15) {
            memset((void *)((long)pmVar15 - lVar10),0,lVar10 + 8);
            lVar26 = local_120._0_8_;
          }
          local_120._0_8_ = lVar26;
          uVar3 = (uint)local_120._0_8_;
          prVar63 = tapes;
        }
        local_128 = uVar17 + 0x81;
        uVar25 = (uint)uVar17 & 7;
        uVar4 = 0x81;
        puVar8 = auStack_190;
        prVar63->pos = (uint32_t)local_128;
        prVar63->aux_pos = uVar3 << 7 | uVar3;
        auVar45._8_8_ = local_160.w64[1];
        auVar45._0_8_ = local_160.w64[0];
        auVar45._16_8_ = local_160.w64[2];
        auVar45._24_8_ = local_160.w64[3];
        auVar46._16_16_ = auStack_90;
        auVar46._0_16_ = local_a0;
        local_130 = (anon_union_8_2_94730226_for_buffer)
                    ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
        auStack_190[0] = 0;
        uVar9 = uVar25 ^ 0xffffffcf;
        uVar17 = (ulong)uVar25 + 0x39;
        uVar3 = ~(-1 << ((byte)(8 - ((byte)local_128 & 7)) & 0x1f));
        uVar23 = local_128;
        do {
          uVar22 = uVar23;
          pbVar6 = puVar7 + (uVar22 >> 3) + 1;
          uVar19 = (ulong)(pbVar6[-1] & uVar3);
          uVar23 = uVar17;
          uVar25 = uVar9;
          do {
            bVar12 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar25 = uVar25 + 8;
            uVar23 = uVar23 - 8;
            uVar19 = (ulong)bVar12 | uVar19 << 8;
          } while (7 < (uint)uVar23);
          if ((uint)uVar23 != 0) {
            sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
            uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                     uVar19 << (uVar23 & 0x3f);
          }
          *puVar8 = uVar19;
          uVar4 = uVar4 - 0x40;
          puVar8 = puVar8 + -1;
          uVar23 = uVar22 + 0x40;
        } while (0x3f < uVar4);
        bVar12 = (byte)uVar22 & 7;
        bVar18 = 8 - bVar12;
        sVar1 = (bVar18 < 0x21) * (' ' - bVar18);
        puVar8 = auStack_190;
        uVar4 = 0x81;
        auVar51._8_8_ = 0;
        auVar51._0_8_ =
             (ulong)((((uint)puVar7[uVar22 + 0x40 >> 3] << sVar1) >> sVar1) >> (bVar12 ^ 7)) << 0x3f
        ;
        auVar51._16_8_ = auStack_190[0];
        auVar51._24_8_ = 0;
        uStack_198 = 0;
        auStack_190[0] = 0;
        auStack_190[1] = 0;
        uVar23 = local_128;
        do {
          uVar22 = uVar23;
          pbVar6 = local_130.w + (uVar22 >> 3) + 1;
          uVar19 = (ulong)(pbVar6[-1] & uVar3);
          uVar23 = uVar17;
          uVar25 = uVar9;
          do {
            bVar12 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar25 = uVar25 + 8;
            uVar23 = uVar23 - 8;
            uVar19 = (ulong)bVar12 | uVar19 << 8;
          } while (7 < (uint)uVar23);
          if ((uint)uVar23 != 0) {
            sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
            uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                     uVar19 << (uVar23 & 0x3f);
          }
          *puVar8 = uVar19;
          uVar4 = uVar4 - 0x40;
          puVar8 = puVar8 + -1;
          uVar23 = uVar22 + 0x40;
        } while (0x3f < uVar4);
        bVar18 = (byte)uVar22 & 7;
        bVar12 = 8 - bVar18;
        sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
        auVar39 = vpand_avx2(auVar45,_DAT_0013a600);
        auVar56 = vpand_avx2(auVar46,_DAT_0013a620);
        auVar43 = vpand_avx2(auVar45,_DAT_0013a640);
        local_1a0.w = (uint8_t *)
                      ((ulong)((((uint)local_130.w[uVar22 + 0x40 >> 3] << sVar1) >> sVar1) >>
                              (bVar18 ^ 7)) << 0x3f);
        auVar48 = vpsllq_avx2(auVar39,2);
        auVar52 = vpsrlq_avx2(auVar39,0x3e);
        auVar39 = vpaddq_avx2(auVar56,auVar56);
        auVar40 = vpsrlq_avx2(auVar56,0x3f);
        auVar56 = vpermq_avx2(auVar52,0x93);
        auVar47 = vpermq_avx2(auVar40,0x93);
        auVar52 = vpor_avx2(auVar56,auVar48);
        auVar40 = vpand_avx2(auVar45,_DAT_0013a620);
        auVar56 = vpaddq_avx2(auVar40,auVar40);
        auVar48 = vpsrlq_avx2(auVar40,0x3f);
        auVar40 = vpand_avx2(auVar43,auVar52);
        auVar48 = vpermq_avx2(auVar48,0x93);
        auVar48 = vpor_avx2(auVar48,auVar56);
        auVar56 = vpand_avx2(auVar43,auVar48);
        auVar39 = vpternlogq_avx512vl(auVar47,auVar52 ^ auVar48,auVar39,0x36);
        auVar43 = vpsrlq_avx2(auVar39,2);
        auVar39 = vpsllq_avx2(auVar39,0x3e);
        auVar39 = vpermq_avx2(auVar39,0x39);
        auVar43 = vpor_avx2(auVar39,auVar43);
        auVar39 = vpand_avx2(auVar46,_DAT_0013a600);
        auVar54 = vpsrlq_avx2(auVar40,2);
        auVar40 = vpsllq_avx2(auVar40,0x3e);
        auVar47 = vpsllq_avx2(auVar39,2);
        auVar39 = vpsrlq_avx2(auVar39,0x3e);
        auVar40 = vpermq_avx2(auVar40,0x39);
        auVar39 = vpermq_avx2(auVar39,0x93);
        auVar47 = vpternlogq_avx512vl(auVar39,auVar52,auVar47,0x36);
        auVar39 = vpand_avx2(auVar52,auVar48);
        auVar49 = vpsrlq_avx2(auVar56,1);
        auVar56 = vpsllq_avx2(auVar56,0x3f);
        auVar56 = vpermq_avx2(auVar56,0x39);
        auVar39 = vpternlogq_avx512vl(auVar39,auVar45 ^ auVar46,_DAT_0013a640,0x78);
        auVar46 = vpsrlq_avx2(auVar47,1);
        auVar45 = vpsllq_avx2(auVar47,0x3f);
        auVar56 = vpternlogq_avx512vl(auVar39,auVar56,auVar49,0x1e);
        auVar39 = vpermq_avx2(auVar45,0x39);
        auVar56 = vpternlogq_avx512vl(auVar56,auVar40,auVar54,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar56,auVar39,auVar46,0x1e);
        auVar39 = vpternlogq_avx512vl(auVar51,auVar39,auVar43,0x96);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = local_1a0;
        auVar47._16_8_ = auStack_190[0];
        auVar47._24_8_ = 0;
        local_120 = vpternlogq_avx512vl(auVar39,auVar52 ^ auVar48,auVar47,0x96);
        v_03[3] = (longlong)prVar63;
        v_03[0] = in_stack_fffffffffffffe40._0_8_;
        v_03[1] = in_stack_fffffffffffffe40._8_8_;
        v_03[2] = in_stack_fffffffffffffe40._16_8_;
        w256_to_bitstream((bitstream_t *)&local_130,v_03,3,0x81);
        local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
        uStack_198 = (ulong)prVar63->aux_pos;
        v_04[3] = (longlong)prVar63;
        v_04[0] = in_stack_fffffffffffffe40._0_8_;
        v_04[1] = in_stack_fffffffffffffe40._8_8_;
        v_04[2] = in_stack_fffffffffffffe40._16_8_;
        tapes = prVar63;
        w256_to_bitstream((bitstream_t *)&local_1a0,v_04,3,0x81);
        prVar63->aux_pos = prVar63->aux_pos + 0x81;
        local_170 = local_170 + 1;
        plVar27 = (lowmc_round_t *)(local_e0._0_8_ + -0x20);
        uVar3 = local_100._0_4_ - 0x102;
      } while (local_170 != 4);
    }
  }
  else if (uVar3 == 0xff0055) {
    local_160.w64[0] = 0;
    local_160.w64[1] = 0;
    local_160.w64[2] = 0;
    local_160.w64[3] = 0;
    mzd_copy_s128_256(local_80,key);
    mzd_mul_v_s128_256(key,local_80,Ki_0);
    plVar27 = rounds + 3;
    local_170 = 0;
    local_e4 = 0x5fa;
    do {
      local_100._0_8_ = plVar27;
      mzd_addmul_v_s128_256(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
      mzd_mul_v_s128_256((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
      if (local_170 == 3) {
        mzd_copy_s128_256(&local_160,local_80);
        local_e0._0_8_ = 0;
        iVar20 = 0;
        puVar7 = tapes->parity_tapes;
        prVar63 = tapes;
      }
      else {
        uVar19 = 0xff;
        lVar26 = 3 - local_170;
        local_120._0_8_ = lVar26;
        puVar7 = tapes->parity_tapes;
        uVar9 = local_e4 & 6;
        uVar3 = -uVar9 - 0x2f;
        uVar23 = (ulong)uVar9 + 0x37;
        uVar17 = (ulong)(uint)((int)lVar26 << 9) + lVar26 * -2;
        pwVar11 = local_160.w64 + 3;
        uVar4 = uVar17;
        do {
          pwVar14 = pwVar11;
          pbVar6 = puVar7 + (uVar4 >> 3) + 1;
          bVar12 = 8 - ((byte)uVar4 & 6);
          sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
          uVar24 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
          uVar22 = (ulong)uVar9 + 0x38;
          uVar25 = -uVar9 - 0x30;
          do {
            bVar18 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar25 = uVar25 + 8;
            uVar22 = uVar22 - 8;
            uVar24 = (ulong)bVar18 | uVar24 << 8;
          } while (7 < (uint)uVar22);
          if ((uint)uVar22 != 0) {
            sVar1 = ((byte)uVar22 < 0x21) * (' ' - (byte)uVar22);
            uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                     uVar24 << (uVar22 & 0x3f);
          }
          uVar4 = uVar4 + 0x40;
          uVar19 = uVar19 - 0x40;
          *pwVar14 = uVar24;
          pwVar11 = pwVar14 + -1;
        } while (0x3f < uVar19);
        pbVar6 = puVar7 + (uVar4 >> 3) + 1;
        uVar4 = (ulong)((uint)pbVar6[-1] & ~(-1 << (bVar12 & 0x1f)));
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar3 = uVar3 + 8;
          uVar23 = uVar23 - 8;
          uVar4 = (ulong)bVar12 | uVar4 << 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar4 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                  uVar4 << (uVar23 & 0x3f);
        }
        local_160.w64[0] = uVar4 * 2;
        pwVar14 = pwVar14 + -2;
        lVar26 = (long)pwVar14 - (long)&local_160;
        local_e0._0_8_ = uVar17;
        if (&local_160 <= pwVar14) {
          memset((void *)((long)pwVar14 - lVar26),0,lVar26 + 8);
        }
        iVar20 = local_120._0_4_;
        prVar63 = tapes;
      }
      local_128 = local_e0._0_8_ + 0xff;
      bVar12 = (char)local_e0._0_8_ + 6;
      uVar19 = 0xff;
      puVar8 = auStack_190 + 1;
      prVar63->pos = (uint32_t)local_128;
      local_e0._0_8_ = local_128;
      prVar63->aux_pos = iVar20 * 0xff;
      auVar37._8_8_ = local_160.w64[1];
      auVar37._0_8_ = local_160.w64[0];
      auVar36._8_8_ = local_160.w64[3];
      auVar36._0_8_ = local_160.w64[2];
      local_130 = (anon_union_8_2_94730226_for_buffer)
                  ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
      auStack_190[1] = 0;
      uVar3 = bVar12 & 7;
      uVar17 = (ulong)(bVar12 & 7);
      uVar25 = ~(-1 << ((byte)(8 - ((byte)local_128 & 7)) & 0x1f));
      uVar9 = uVar3 ^ 0xffffffcf;
      uVar23 = uVar17 + 0x39;
      uVar4 = local_128;
      do {
        uVar22 = uVar4;
        pbVar6 = puVar7 + (uVar22 >> 3) + 1;
        uVar24 = (ulong)(pbVar6[-1] & uVar25);
        uVar4 = uVar23;
        uVar13 = uVar9;
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar13 = uVar13 + 8;
          uVar4 = uVar4 - 8;
          uVar24 = (ulong)bVar12 | uVar24 << 8;
        } while (7 < (uint)uVar4);
        if ((uint)uVar4 != 0) {
          sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
          uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar13 & 0x1f)) << sVar1) >> sVar1) |
                   uVar24 << (uVar4 & 0x3f);
        }
        *puVar8 = uVar24;
        uVar19 = uVar19 - 0x40;
        puVar8 = puVar8 + -1;
        uVar4 = uVar22 + 0x40;
      } while (0x3f < uVar19);
      uVar17 = uVar17 | 0x38;
      pbVar6 = puVar7 + (uVar22 + 0x40 >> 3) + 1;
      bVar12 = 8 - ((byte)uVar22 & 7);
      uVar13 = -uVar3 - 0x30;
      sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
      uVar19 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
      uVar4 = uVar17;
      uVar3 = uVar13;
      do {
        bVar12 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar3 = uVar3 + 8;
        uVar4 = uVar4 - 8;
        uVar19 = (ulong)bVar12 | uVar19 << 8;
      } while (7 < (uint)uVar4);
      if ((uint)uVar4 != 0) {
        sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
        uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                 uVar19 << (uVar4 & 0x3f);
      }
      puVar8 = auStack_190 + 1;
      uVar22 = 0xff;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar19 * 2;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auStack_190[1];
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      uVar4 = local_128;
      do {
        uVar19 = uVar4;
        pbVar6 = local_130.w + (uVar19 >> 3) + 1;
        uVar24 = (ulong)(pbVar6[-1] & uVar25);
        uVar4 = uVar23;
        uVar3 = uVar9;
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar3 = uVar3 + 8;
          uVar4 = uVar4 - 8;
          uVar24 = (ulong)bVar12 | uVar24 << 8;
        } while (7 < (uint)uVar4);
        if ((uint)uVar4 != 0) {
          sVar1 = ((byte)uVar4 < 0x21) * (' ' - (byte)uVar4);
          uVar24 = (ulong)(((uint)(*pbVar6 >> (uVar3 & 0x1f)) << sVar1) >> sVar1) |
                   uVar24 << (uVar4 & 0x3f);
        }
        *puVar8 = uVar24;
        uVar22 = uVar22 - 0x40;
        puVar8 = puVar8 + -1;
        uVar4 = uVar19 + 0x40;
      } while (0x3f < uVar22);
      pbVar6 = local_130.w + (uVar19 + 0x40 >> 3) + 1;
      bVar12 = 8 - ((byte)uVar19 & 7);
      sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
      uVar23 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
      do {
        bVar12 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar13 = uVar13 + 8;
        uVar17 = uVar17 - 8;
        uVar23 = (ulong)bVar12 | uVar23 << 8;
      } while (7 < (uint)uVar17);
      uVar2 = local_100._0_8_;
      if ((uint)uVar17 != 0) {
        sVar1 = ((byte)uVar17 < 0x21) * (' ' - (byte)uVar17);
        uVar23 = (ulong)(((uint)(*pbVar6 >> (uVar13 & 0x1f)) << sVar1) >> sVar1) |
                 uVar23 << (uVar17 & 0x3f);
      }
      auVar30 = vpslldq_avx(auStack_90,8);
      local_1a0.w = (uint8_t *)(uVar23 * 2);
      auVar28 = vandpd_avx(_DAT_0013a7c0,auVar36);
      auVar29 = vandpd_avx(_DAT_0013a7a0,auStack_90);
      auVar58 = vpslldq_avx(auVar28,8);
      auVar32 = vpshldq_avx512_vbmi2(auVar29,auVar30,1);
      auVar33 = vandpd_avx512vl(local_a0,_DAT_0013a7c0);
      auVar28 = vpshldq_avx512_vbmi2(auVar28,auVar58,2);
      auVar58 = vandpd_avx512vl(auVar37,_DAT_0013a7b0);
      auVar29 = vpsrldq_avx(auVar58,8);
      auVar29 = vpsrlq_avx(auVar29,0x3e);
      auVar30 = vpor_avx(auVar29,auVar28);
      auVar28 = vandpd_avx(_DAT_0013a7a0,auVar36);
      auVar29 = vpslldq_avx(auVar36,8);
      auVar34 = vpshldq_avx512_vbmi2(auVar28,auVar29,1);
      auVar35 = vandpd_avx512vl(auVar37,_DAT_0013a7c0);
      auVar28 = vandpd_avx(_DAT_0013a7c0,auStack_90);
      auVar41 = vpternlogq_avx512vl(auStack_90,_DAT_0013a7b0,auVar36,0x48);
      auVar36 = vpand_avx(_DAT_0013a7b0,auVar36);
      auVar29 = vpslldq_avx(auVar28,8);
      auVar28 = vpshldq_avx512_vbmi2(auVar28,auVar29,2);
      auVar38 = vandpd_avx512vl(local_a0,_DAT_0013a7b0);
      auVar29 = vpand_avx(auVar30,auVar36);
      auVar36 = vpand_avx(auVar34,auVar36);
      auVar59 = vpsrldq_avx(auVar38,8);
      auVar62 = vpsrldq_avx512vl(auVar36,8);
      auVar50 = vpsrldq_avx512vl(auVar29,8);
      auVar32 = auVar34 ^ auVar30 ^ auVar32;
      auVar60 = vpsrlq_avx(auVar59,0x3e);
      auVar59 = vpshldq_avx512_vbmi2(auVar62._0_16_,auVar36,0x3f);
      auVar42 = vpshldq_avx512_vbmi2(auVar50._0_16_,auVar29,0x3e);
      auVar61 = vpsrldq_avx(auVar32,8);
      auVar60 = vpternlogq_avx512vl(auVar60,auVar30,auVar28,0x36);
      auVar36 = vpand_avx(auVar34,auVar30);
      auVar61 = vpshldq_avx512_vbmi2(auVar61,auVar32,0x3e);
      auVar44 = vpslldq_avx(auVar32,8);
      auVar57 = vpsrldq_avx(auVar60,8);
      auVar32 = vpternlogq_avx512vl(auVar36,auVar59,auVar41,0x96);
      auVar36 = vpaddq_avx(auVar33,auVar33);
      auVar41 = vpsllq_avx(auVar58,2);
      auVar28 = vpaddq_avx(auVar35,auVar35);
      auVar33 = vpshldq_avx512_vbmi2(auVar57,auVar60,0x3f);
      auVar32 = vpternlogq_avx512vl(auVar32,auVar33,auVar42,0x96);
      auVar31 = vpternlogq_avx512vl(auVar31 << 0x40,auVar32,auVar61,0x96);
      auVar59 = vpslldq_avx(auVar29,8);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auStack_190[1];
      local_120._0_16_ = vpternlogq_avx512vl(auVar31,auVar34 ^ auVar30,auVar32 << 0x40,0x96);
      auVar29 = vpshldq_avx512_vbmi2(auVar44,auVar36 ^ auVar41 ^ auVar28,0x3e);
      auVar33._0_8_ = auVar38._0_8_ ^ auVar58._0_8_;
      auVar33._8_8_ = auVar38._8_8_ ^ auVar58._8_8_;
      auVar31 = vpslldq_avx(auVar60,8);
      auVar30 = vxorpd_avx512vl(local_a0,auVar37);
      auVar36 = vpaddq_avx(auVar33,auVar33);
      auVar33 = vpsllq_avx(auVar31,0x3f);
      auVar32 = vandpd_avx512vl(auVar37,_DAT_0013a7d0);
      auVar37 = vpand_avx(auVar32,auVar41);
      auVar31 = vpand_avx(auVar41,auVar28);
      auVar58 = vpsrlq_avx(auVar32,1);
      auVar32 = vpshldq_avx512_vbmi2(auVar59,auVar37,0x3e);
      auVar37 = vpand_avx(auVar58,auVar35);
      auVar31 = vpternlogq_avx512vl(auVar31,auVar30,_DAT_0013a7d0,0x78);
      auVar37 = vpternlogq_avx512vl(auVar31,auVar32,auVar37,0x96);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar33,auVar36,0x1e);
      auVar37 = vpternlogq_avx512vl(auVar53,auVar37,auVar29,0x96);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_1a0;
      local_b0 = vpternlogq_avx512vl(auVar37,auVar41 ^ auVar28,auVar29,0x96);
      w128_to_bitstream((bitstream_t *)&local_130,(word128 *)0x4,0xff,uVar17);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
      uStack_198 = (ulong)prVar63->aux_pos;
      tapes = prVar63;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)0x4,0xff,uVar17);
      prVar63->aux_pos = prVar63->aux_pos + 0xff;
      local_e4 = local_e4 - 0x1fe;
      plVar27 = (lowmc_round_t *)(uVar2 + -0x20);
      local_170 = local_170 + 1;
    } while (local_170 != 4);
  }
  else if (uVar3 == 0xc00040) {
    local_160.w64[0] = 0;
    local_160.w64[1] = 0;
    local_160.w64[2] = 0;
    local_160.w64[3] = 0;
    mzd_copy_s128_256(local_80,key);
    mzd_mul_v_s128_192(key,local_80,Ki_0);
    plVar27 = rounds + 3;
    uVar23 = 0x480;
    puVar5 = &stack0xfffffffffffffe90;
    if ((undefined8 *)((long)local_168 + 7) < &stack0xfffffffffffffe90) {
      puVar5 = (undefined8 *)((long)local_168 + 7);
    }
    lVar26 = 0;
    uVar4 = (long)local_168 + (0xffffffffffffffffU - (long)puVar5) & 0xfffffffffffffff8;
    local_120._0_8_ = uVar4 + 8;
    local_b0._0_8_ = (long)local_168 - uVar4;
    do {
      mzd_addmul_v_s128_192(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
      mzd_mul_v_s128_192((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
      local_170 = uVar23;
      if (lVar26 == 3) {
        mzd_copy_s128_256(&local_160,local_80);
        uVar4 = 0;
        iVar20 = 0;
        puVar7 = tapes->parity_tapes;
        prVar63 = tapes;
      }
      else {
        pwVar11 = local_160.w64 + 2;
        iVar20 = 3 - (int)lVar26;
        uVar4 = (ulong)(uint)(iVar20 * 0x80) * 3;
        lVar10 = 0xc0;
        puVar7 = tapes->parity_tapes;
        pbVar6 = puVar7 + (uVar23 >> 3) + 1;
        uVar23 = uVar4;
        do {
          iVar16 = -0x38;
          uVar17 = (ulong)puVar7[uVar23 >> 3];
          pbVar21 = pbVar6;
          do {
            bVar12 = *pbVar21;
            pbVar21 = pbVar21 + 1;
            uVar17 = (ulong)bVar12 | uVar17 << 8;
            iVar16 = iVar16 + 8;
          } while (iVar16 != 0);
          *pwVar11 = uVar17;
          uVar23 = uVar23 + 0x40;
          pwVar11 = pwVar11 + -1;
          pbVar6 = pbVar6 + 8;
          lVar10 = lVar10 + -0x40;
        } while (lVar10 != 0);
        prVar63 = tapes;
        if (&local_160 <= pwVar11) {
          memset((void *)local_b0._0_8_,0,local_120._0_8_);
          prVar63 = tapes;
        }
      }
      uVar23 = local_170;
      local_128 = uVar4 + 0xc0;
      lVar10 = 0xc0;
      puVar8 = auStack_190;
      prVar63->pos = (uint32_t)local_128;
      prVar63->aux_pos = iVar20 * 0xc0;
      auVar38._8_8_ = local_160.w64[1];
      auVar38._0_8_ = local_160.w64[0];
      auVar59._8_8_ = local_160.w64[3];
      auVar59._0_8_ = local_160.w64[2];
      local_130 = (anon_union_8_2_94730226_for_buffer)
                  ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
      uVar17 = local_128 >> 3 & 0x1fffffff;
      auStack_190[0] = 0;
      pbVar6 = puVar7 + uVar17 + 1;
      uVar4 = local_128;
      do {
        iVar20 = -0x38;
        uVar19 = (ulong)puVar7[uVar4 >> 3];
        pbVar21 = pbVar6;
        do {
          bVar12 = *pbVar21;
          pbVar21 = pbVar21 + 1;
          uVar19 = (ulong)bVar12 | uVar19 << 8;
          iVar20 = iVar20 + 8;
        } while (iVar20 != 0);
        *puVar8 = uVar19;
        uVar4 = uVar4 + 0x40;
        puVar8 = puVar8 + -1;
        pbVar6 = pbVar6 + 8;
        lVar10 = lVar10 + -0x40;
      } while (lVar10 != 0);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = auStack_190[0];
      pbVar6 = local_130.w + uVar17 + 1;
      lVar10 = 0xc0;
      puVar8 = auStack_190;
      local_1a0.w = (uint8_t *)0x0;
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      uVar4 = local_128;
      do {
        iVar20 = -0x38;
        uVar17 = (ulong)local_130.w[uVar4 >> 3];
        pbVar21 = pbVar6;
        do {
          bVar12 = *pbVar21;
          pbVar21 = pbVar21 + 1;
          uVar17 = (ulong)bVar12 | uVar17 << 8;
          iVar20 = iVar20 + 8;
        } while (iVar20 != 0);
        *puVar8 = uVar17;
        uVar4 = uVar4 + 0x40;
        puVar8 = puVar8 + -1;
        pbVar6 = pbVar6 + 8;
        lVar10 = lVar10 + -0x40;
      } while (lVar10 != 0);
      auVar50 = vpsrldq_avx512vl(local_a0,8);
      auVar28 = vandpd_avx512vl(local_a0,_DAT_0013a7b0);
      auVar37 = vpand_avx(ZEXT816(0x4924924924924924),auStack_90);
      auVar29 = vandpd_avx512vl(auVar38,_DAT_0013a7a0);
      auVar30 = vandpd_avx512vl(local_a0,_DAT_0013a7a0);
      auVar31 = vpshldq_avx512_vbmi2(auVar37,auVar50._0_16_,1);
      auVar37 = vpand_avx(ZEXT816(0x2492492492492492),auVar59);
      auVar53 = vpsrldq_avx(auVar29,8);
      auVar36 = vpand_avx(ZEXT816(0x2492492492492492),auStack_90);
      auVar58 = vpsrldq_avx(auVar30,8);
      auVar32 = vpternlogq_avx512vl(auStack_90,ZEXT816(0x9249249249249249),auVar59,0x48);
      auVar33 = vpshldq_avx512_vbmi2(auVar37,auVar53,2);
      auVar37 = vpand_avx(ZEXT816(0x4924924924924924),auVar59);
      auVar50 = vpsrldq_avx512vl(auVar38,8);
      auVar58 = vpshldq_avx512_vbmi2(auVar36,auVar58,2);
      auVar36 = vpand_avx(ZEXT816(0x9249249249249249),auVar59);
      auVar34 = vpshldq_avx512_vbmi2(auVar37,auVar50._0_16_,1);
      auVar53 = vpand_avx(auVar33,auVar36);
      auVar37 = vpand_avx(auVar34,auVar36);
      auVar36 = vpand_avx(auVar34,auVar33);
      auVar59 = vpsrlq_avx(auVar58 ^ auVar33,1);
      auVar60 = vpsrlq_avx(auVar53,2);
      auVar35 = vpsrlq_avx512vl(auVar37,1);
      auVar31 = auVar34 ^ auVar33 ^ auVar31;
      auVar41 = vpslldq_avx(auVar37,8);
      auVar36 = vpternlogq_avx512vl(auVar36,auVar35,auVar32,0xde);
      auVar35 = vpsrlq_avx(auVar31,2);
      auVar37 = vpaddq_avx(auVar28,auVar28);
      auVar28 = vpslldq_avx(auVar29,8);
      auVar31 = vpslldq_avx(auVar31,8);
      auVar36 = vpternlogq_avx512vl(auVar36,auVar59,auVar60,0x36);
      auVar28 = vpshldq_avx512_vbmi2(auVar29,auVar28,2);
      auVar32 = vpsllq_avx(auVar31,0x3e);
      auVar36 = vpternlogq_avx512vl(auVar42,auVar36,auVar35,0x96);
      auVar31 = vpaddq_avx512vl(auVar38,auVar38);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = auStack_190[0];
      local_e0._0_16_ = vpternlogq_avx512vl(auVar36,auVar34 ^ auVar33,auVar60,0x96);
      auVar36 = vpand_avx(_DAT_0013a7c0,auVar31);
      auVar37 = auVar37 ^ auVar28 ^ auVar36;
      auVar31 = vpsrldq_avx(auVar37,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar31,auVar37,0x3e);
      auVar33 = vpslldq_avx(auVar58 ^ auVar33,8);
      auVar29 = vpandq_avx512vl(auVar38,_DAT_0013a7c0);
      auVar31 = vpor_avx(auVar32,auVar37);
      auVar50 = vpslldq_avx512vl(local_a0,8);
      auVar32 = vpternlogq_avx512vl(local_a0,_DAT_0013a7c0,auVar38,0x48);
      auVar37 = vpshldq_avx512_vbmi2(auVar30,auVar50._0_16_,2);
      auVar30 = vpshldq_avx512_vbmi2(auVar33,auVar37 ^ auVar28,0x3f);
      auVar37 = vpand_avx(auVar29,auVar28);
      auVar33 = vpsrldq_avx(auVar37,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar33,auVar37,0x3e);
      auVar53 = vpslldq_avx(auVar53,8);
      auVar53 = vpsllq_avx(auVar53,0x3e);
      auVar53 = vpor_avx(auVar53,auVar37);
      auVar37 = vpand_avx(auVar29,auVar36);
      auVar29 = vpshldq_avx512_vbmi2(auVar41,auVar37,0x3f);
      auVar37 = vpand_avx(auVar28,auVar36);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar29,auVar32,0x96);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar30,auVar53,0x96);
      auVar37 = vpternlogq_avx512vl(ZEXT816(0),auVar37,auVar31,0x96);
      local_100 = vpternlogq_avx512vl(auVar37,auVar28 ^ auVar36,ZEXT816(0),0x96);
      w128_to_bitstream((bitstream_t *)&local_130,(word128 *)0x3,0xc0,(size_t)pbVar6);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
      uStack_198 = (ulong)prVar63->aux_pos;
      tapes = prVar63;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)0x3,0xc0,(size_t)pbVar6);
      prVar63->aux_pos = prVar63->aux_pos + 0xc0;
      lVar26 = lVar26 + 1;
      plVar27 = plVar27 + -1;
      uVar23 = uVar23 - 0x180;
    } while (lVar26 != 4);
  }
  else {
    local_160.w64[0] = 0;
    local_160.w64[1] = 0;
    local_160.w64[2] = 0;
    local_160.w64[3] = 0;
    mzd_copy_s128_256(local_80,key);
    mzd_mul_v_s128_129(key,local_80,Ki_0);
    plVar27 = rounds + 3;
    uVar3 = 0x306;
    local_170 = 0;
    do {
      mzd_addmul_v_s128_129(&local_160,(mzd_local_t *)local_168,plVar27->k_matrix);
      local_e0._0_8_ = plVar27;
      mzd_mul_v_s128_129((mzd_local_t *)local_a0,&local_160,plVar27->li_matrix);
      local_100._0_4_ = uVar3;
      if (local_170 == 3) {
        mzd_copy_s128_256(&local_160,local_80);
        uVar17 = 0;
        uVar3 = 0;
        puVar7 = tapes->parity_tapes;
        prVar63 = tapes;
      }
      else {
        uVar4 = 0x81;
        local_120._0_8_ = 3 - local_170;
        puVar7 = tapes->parity_tapes;
        uVar17 = (ulong)(uint)((int)(3 - local_170) * 0x102);
        pwVar11 = local_160.w64 + 2;
        uVar23 = uVar17;
        do {
          pwVar14 = pwVar11;
          uVar25 = (uint)uVar23 & 6;
          pbVar6 = puVar7 + (uVar23 >> 3) + 1;
          bVar12 = 8 - (char)uVar25;
          sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
          uVar22 = (ulong)(((uint)pbVar6[-1] << sVar1) >> sVar1);
          uVar19 = (ulong)(uVar3 & 6) | 0x38;
          uVar9 = -(uVar3 & 6) - 0x30;
          do {
            bVar18 = *pbVar6;
            pbVar6 = pbVar6 + 1;
            uVar9 = uVar9 + 8;
            uVar19 = uVar19 - 8;
            uVar22 = (ulong)bVar18 | uVar22 << 8;
          } while (7 < (uint)uVar19);
          if ((uint)uVar19 != 0) {
            sVar1 = ((byte)uVar19 < 0x21) * (' ' - (byte)uVar19);
            uVar22 = (ulong)(((uint)(*pbVar6 >> (uVar9 & 0x1f)) << sVar1) >> sVar1) |
                     uVar22 << (uVar19 & 0x3f);
          }
          uVar23 = uVar23 + 0x40;
          uVar4 = uVar4 - 0x40;
          *pwVar14 = uVar22;
          pwVar11 = pwVar14 + -1;
        } while (0x3f < uVar4);
        pmVar15 = (mzd_local_t *)(pwVar14 + -2);
        local_160.w64[0] =
             (ulong)(((uint)puVar7[uVar23 >> 3] & ~(-1 << (bVar12 & 0x1f))) >> ((ulong)uVar25 ^ 7))
             << 0x3f;
        lVar26 = (long)pmVar15 - (long)&local_160;
        if (&local_160 <= pmVar15) {
          memset((void *)((long)pmVar15 - lVar26),0,lVar26 + 8);
        }
        uVar3 = local_120._0_4_;
        prVar63 = tapes;
      }
      local_128 = uVar17 + 0x81;
      uVar25 = (uint)uVar17 & 7;
      uVar4 = 0x81;
      puVar8 = auStack_190;
      prVar63->pos = (uint32_t)local_128;
      prVar63->aux_pos = uVar3 << 7 | uVar3;
      auVar28._8_8_ = local_160.w64[1];
      auVar28._0_8_ = local_160.w64[0];
      auVar30._8_8_ = local_160.w64[3];
      auVar30._0_8_ = local_160.w64[2];
      local_130 = (anon_union_8_2_94730226_for_buffer)
                  ((anon_union_8_2_94730226_for_buffer *)(prVar63->tape + 0xf))->w;
      auStack_190[0] = 0;
      uVar9 = uVar25 ^ 0xffffffcf;
      uVar17 = (ulong)uVar25 + 0x39;
      uVar3 = ~(-1 << ((byte)(8 - ((byte)local_128 & 7)) & 0x1f));
      uVar23 = local_128;
      do {
        uVar22 = uVar23;
        pbVar6 = puVar7 + (uVar22 >> 3) + 1;
        uVar19 = (ulong)(pbVar6[-1] & uVar3);
        uVar23 = uVar17;
        uVar25 = uVar9;
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar25 = uVar25 + 8;
          uVar23 = uVar23 - 8;
          uVar19 = (ulong)bVar12 | uVar19 << 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                   uVar19 << (uVar23 & 0x3f);
        }
        *puVar8 = uVar19;
        uVar4 = uVar4 - 0x40;
        puVar8 = puVar8 + -1;
        uVar23 = uVar22 + 0x40;
      } while (0x3f < uVar4);
      bVar12 = (byte)uVar22 & 7;
      bVar18 = 8 - bVar12;
      sVar1 = (bVar18 < 0x21) * (' ' - bVar18);
      puVar8 = auStack_190;
      uVar4 = 0x81;
      auVar58._8_8_ = 0;
      auVar58._0_8_ =
           (ulong)((((uint)puVar7[uVar22 + 0x40 >> 3] << sVar1) >> sVar1) >> (bVar12 ^ 7)) << 0x3f;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auStack_190[0];
      uStack_198 = 0;
      auStack_190[0] = 0;
      auStack_190[1] = 0;
      uVar23 = local_128;
      do {
        uVar22 = uVar23;
        pbVar6 = local_130.w + (uVar22 >> 3) + 1;
        uVar19 = (ulong)(pbVar6[-1] & uVar3);
        uVar23 = uVar17;
        uVar25 = uVar9;
        do {
          bVar12 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar25 = uVar25 + 8;
          uVar23 = uVar23 - 8;
          uVar19 = (ulong)bVar12 | uVar19 << 8;
        } while (7 < (uint)uVar23);
        if ((uint)uVar23 != 0) {
          sVar1 = ((byte)uVar23 < 0x21) * (' ' - (byte)uVar23);
          uVar19 = (ulong)(((uint)(*pbVar6 >> (uVar25 & 0x1f)) << sVar1) >> sVar1) |
                   uVar19 << (uVar23 & 0x3f);
        }
        *puVar8 = uVar19;
        uVar4 = uVar4 - 0x40;
        puVar8 = puVar8 + -1;
        uVar23 = uVar22 + 0x40;
      } while (0x3f < uVar4);
      auVar50 = vpsrldq_avx512vl(local_a0,8);
      auVar29 = vandpd_avx512vl(local_a0,_DAT_0013a760);
      bVar18 = (byte)uVar22 & 7;
      bVar12 = 8 - bVar18;
      sVar1 = (bVar12 < 0x21) * (' ' - bVar12);
      auVar37 = vpand_avx(ZEXT816(0x4924924924924924),auStack_90);
      auVar32 = vandpd_avx512vl(auVar28,_DAT_0013a740);
      auVar33 = vandpd_avx512vl(local_a0,_DAT_0013a740);
      size.w = (uint8_t *)
               ((ulong)((((uint)local_130.w[uVar22 + 0x40 >> 3] << sVar1) >> sVar1) >> (bVar18 ^ 7))
               << 0x3f);
      auVar31 = vpshldq_avx512_vbmi2(auVar37,auVar50._0_16_,1);
      auVar37 = vpand_avx(ZEXT816(0x2492492492492492),auVar30);
      auVar53 = vpsrldq_avx(auVar32,8);
      auVar36 = vpand_avx(ZEXT816(0x2492492492492492),auStack_90);
      auVar41 = vpsrldq_avx(auVar33,8);
      auVar35 = vpternlogq_avx512vl(auStack_90,ZEXT816(0x9249249249249249),auVar30,0x48);
      auVar38 = vpshldq_avx512_vbmi2(auVar37,auVar53,2);
      auVar37 = vpand_avx(ZEXT816(0x4924924924924924),auVar30);
      auVar50 = vpsrldq_avx512vl(auVar28,8);
      auVar59 = vpshldq_avx512_vbmi2(auVar36,auVar41,2);
      auVar36 = vpand_avx(ZEXT816(0x9249249249249249),auVar30);
      auVar30 = vpshldq_avx512_vbmi2(auVar37,auVar50._0_16_,1);
      auVar53 = vpand_avx(auVar38,auVar36);
      auVar37 = vpand_avx(auVar30,auVar36);
      auVar36 = vpand_avx(auVar30,auVar38);
      auVar60 = vpsrlq_avx(auVar59 ^ auVar38,1);
      auVar61 = vpsrlq_avx(auVar53,2);
      auVar41 = vpsrlq_avx512vl(auVar37,1);
      auVar31 = auVar30 ^ auVar38 ^ auVar31;
      auVar42 = vpslldq_avx(auVar37,8);
      auVar36 = vpternlogq_avx512vl(auVar36,auVar41,auVar35,0xde);
      auVar35 = vpsrlq_avx(auVar31,2);
      auVar37 = vpaddq_avx(auVar29,auVar29);
      auVar29 = vpslldq_avx(auVar32,8);
      auVar31 = vpslldq_avx(auVar31,8);
      auVar36 = vpternlogq_avx512vl(auVar36,auVar60,auVar61,0x36);
      auVar29 = vpshldq_avx512_vbmi2(auVar32,auVar29,2);
      auVar32 = vpsllq_avx(auVar31,0x3e);
      auVar36 = vpternlogq_avx512vl(auVar34,auVar36,auVar35,0x96);
      auVar31 = vpaddq_avx512vl(auVar28,auVar28);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = auStack_190[0];
      local_120._0_16_ = vpternlogq_avx512vl(auVar36,auVar30 ^ auVar38,auVar41,0x96);
      auVar36 = vpand_avx(_DAT_0013a780,auVar31);
      auVar37 = auVar37 ^ auVar29 ^ auVar36;
      auVar31 = vpsrldq_avx(auVar37,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar31,auVar37,0x3e);
      auVar34 = vpslldq_avx(auVar59 ^ auVar38,8);
      auVar30 = vpandq_avx512vl(auVar28,_DAT_0013a780);
      auVar31 = vpor_avx(auVar32,auVar37);
      auVar50 = vpslldq_avx512vl(local_a0,8);
      auVar28 = vpternlogq_avx512vl(local_a0,_DAT_0013a780,auVar28,0x48);
      auVar37 = vpshldq_avx512_vbmi2(auVar33,auVar50._0_16_,2);
      auVar32 = vpshldq_avx512_vbmi2(auVar34,auVar37 ^ auVar29,0x3f);
      auVar37 = vpand_avx(auVar30,auVar29);
      auVar33 = vpsrldq_avx(auVar37,8);
      auVar37 = vpshldq_avx512_vbmi2(auVar33,auVar37,0x3e);
      auVar53 = vpslldq_avx(auVar53,8);
      auVar53 = vpsllq_avx(auVar53,0x3e);
      auVar53 = vpor_avx(auVar53,auVar37);
      auVar37 = vpand_avx(auVar30,auVar36);
      auVar30 = vpshldq_avx512_vbmi2(auVar42,auVar37,0x3f);
      auVar37 = vpand_avx(auVar29,auVar36);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar30,auVar28,0xde);
      auVar37 = vpternlogq_avx512vl(auVar37,auVar32,auVar53,0x96);
      auVar37 = vpternlogq_avx512vl(auVar58,auVar37,auVar31,0x96);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = size;
      local_b0 = vpternlogq_avx512vl(auVar37,auVar29 ^ auVar36,auVar35,0x96);
      local_1a0.w = size.w;
      w128_to_bitstream((bitstream_t *)&local_130,(word128 *)0x3,0x81,(size_t)size);
      local_1a0 = (anon_union_8_2_94730226_for_buffer)prVar63->aux_bits;
      uStack_198 = (ulong)prVar63->aux_pos;
      tapes = prVar63;
      w128_to_bitstream((bitstream_t *)&local_1a0,(word128 *)0x3,0x81,(size_t)size);
      prVar63->aux_pos = prVar63->aux_pos + 0x81;
      local_170 = local_170 + 1;
      plVar27 = (lowmc_round_t *)(local_e0._0_8_ + -0x20);
      uVar3 = local_100._0_4_ - 0x102;
    } while (local_170 != 4);
  }
  return;
}

Assistant:

void lowmc_compute_aux(const lowmc_parameters_t* lowmc, lowmc_key_t* key, randomTape_t* tapes) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s256_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s256_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s256_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s128_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s128_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s128_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_aux_uint64_lowmc_129_129_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_aux_uint64_lowmc_192_192_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_aux_uint64_lowmc_255_255_4(key, tapes);
    return;
#endif
  }
#endif

  UNREACHABLE;
}